

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

void __thiscall rw::Skin::findNumWeights(Skin *this,int32 numVertices)

{
  float *local_20;
  float *w;
  int32 numVertices_local;
  Skin *this_local;
  
  this->numWeights = 1;
  local_20 = this->weights;
  w._4_4_ = numVertices;
  do {
    if (w._4_4_ == 0) {
      return;
    }
    while ((local_20[this->numWeights] != 0.0 || (NAN(local_20[this->numWeights])))) {
      this->numWeights = this->numWeights + 1;
      if (this->numWeights == 4) {
        return;
      }
    }
    local_20 = local_20 + 4;
    w._4_4_ = w._4_4_ + -1;
  } while( true );
}

Assistant:

void
Skin::findNumWeights(int32 numVertices)
{
	this->numWeights = 1;
	float *w = this->weights;
	while(numVertices--){
		while(w[this->numWeights] != 0.0f){
			this->numWeights++;
			if(this->numWeights == 4)
				return;
		}
		w += 4;
	}
}